

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O0

int __thiscall
QCommonStyle::pixelMetric(QCommonStyle *this,PixelMetric m,QStyleOption *opt,QWidget *widget)

{
  bool bVar1;
  int iVar2;
  QStyleOptionTitleBar *pQVar3;
  QDockWidget *pQVar4;
  int *piVar5;
  QStyleOptionSlider *pQVar6;
  QStyleOptionTab *pQVar7;
  QSidebar *pQVar8;
  QStyle *pQVar9;
  QPlatformTheme *pQVar10;
  long in_RCX;
  QStyleOption *in_RDX;
  undefined4 in_ESI;
  QStyle *in_RDI;
  long in_FS_OFFSET;
  qreal qVar11;
  QPlatformTheme *theme;
  bool isWindow;
  QStyleOptionTab *tb_1;
  QStyleOptionSlider *sl_1;
  int ticks;
  int thickness;
  int space;
  QStyleOptionSlider *sl;
  QStyleOptionTitleBar *tb;
  int ret;
  undefined4 in_stack_fffffffffffffec8;
  StateFlag in_stack_fffffffffffffecc;
  WindowType in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int local_128;
  QFlagsStorage<Qt::WindowType> in_stack_fffffffffffffedc;
  bool local_d6;
  bool local_d5;
  int local_c4;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_a0;
  int local_9c;
  QFontMetrics local_98 [8];
  int local_90;
  int local_8c;
  QFontMetrics local_88 [8];
  int local_80 [2];
  QFontMetrics local_78 [12];
  int local_6c;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_ESI) {
  case 0:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 1:
    local_c4 = 0;
    break;
  case 2:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 3:
  case 4:
  case 5:
    local_c4 = 2;
    break;
  case 6:
  case 7:
  case 0x16:
  case 0x17:
  case 0x1e:
    pQVar9 = QStyle::proxy(in_RDI);
    local_c4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,5,in_RDX,in_RCX);
    break;
  case 8:
    pQVar10 = QGuiApplicationPrivate::platformTheme();
    (**(code **)(*(long *)pQVar10 + 0x60))(&local_28,pQVar10,10);
    local_c4 = ::QVariant::toInt((bool *)&local_28);
    ::QVariant::~QVariant(&local_28);
    break;
  case 9:
    pQVar6 = qstyleoption_cast<QStyleOptionSlider_const*>(in_RDX);
    if (pQVar6 == (QStyleOptionSlider *)0x0) {
      qVar11 = QStyleHelper::dpiScaled
                         ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (QStyleOption *)
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_c4 = (int)qVar11;
    }
    else {
      local_c4 = 0x10;
    }
    break;
  case 10:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0xb:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  default:
    local_c4 = 0;
    break;
  case 0xe:
    pQVar6 = qstyleoption_cast<QStyleOptionSlider_const*>(in_RDX);
    if (pQVar6 == (QStyleOptionSlider *)0x0) {
      local_c4 = 0;
    }
    else {
      if (pQVar6->orientation == Horizontal) {
        local_c4 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffecc,
                                                   in_stack_fffffffffffffec8));
      }
      else {
        local_c4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffecc,
                                                  in_stack_fffffffffffffec8));
      }
      pQVar9 = QStyle::proxy(in_RDI);
      iVar2 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0xc,pQVar6,in_RCX);
      if (pQVar6->tickPosition == TicksBothSides) {
        local_c4 = (local_c4 - iVar2) / 2;
      }
      else if (pQVar6->tickPosition == TicksAbove) {
        local_c4 = local_c4 - iVar2;
      }
      else {
        local_c4 = 0;
      }
    }
    break;
  case 0xf:
    pQVar6 = qstyleoption_cast<QStyleOptionSlider_const*>(in_RDX);
    if (pQVar6 == (QStyleOptionSlider *)0x0) {
      local_c4 = 0;
    }
    else if (pQVar6->orientation == Horizontal) {
      local_c4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                             );
      pQVar9 = QStyle::proxy(in_RDI);
      iVar2 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0xd,pQVar6,in_RCX);
      local_c4 = local_c4 - iVar2;
    }
    else {
      local_c4 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                                                ));
      pQVar9 = QStyle::proxy(in_RDI);
      iVar2 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0xd,pQVar6,in_RCX);
      local_c4 = local_c4 - iVar2;
    }
    break;
  case 0x10:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x11:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x12:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x13:
    local_c4 = 3;
    break;
  case 0x14:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x15:
    pQVar7 = qstyleoption_cast<QStyleOptionTab_const*>(in_RDX);
    if ((pQVar7 == (QStyleOptionTab *)0x0) ||
       ((((pQVar7->shape != RoundedNorth && (pQVar7->shape != RoundedSouth)) &&
         (pQVar7->shape != RoundedWest)) && (pQVar7->shape != RoundedEast)))) {
      if ((pQVar7 == (QStyleOptionTab *)0x0) ||
         ((pQVar7->shape != TriangularWest && (pQVar7->shape != TriangularEast)))) {
        local_c4 = 2;
      }
      else {
        local_c4 = 3;
      }
    }
    else {
      local_c4 = 8;
    }
    break;
  case 0x18:
    local_c4 = 9;
    break;
  case 0x1a:
    pQVar3 = qstyleoption_cast<QStyleOptionTitleBar_const*>(in_RDX);
    if (pQVar3 == (QStyleOptionTitleBar *)0x0) {
      qVar11 = QStyleHelper::dpiScaled
                         ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (QStyleOption *)
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_c4 = (int)qVar11;
    }
    else {
      QFlags<Qt::WindowType>::operator&
                ((QFlags<Qt::WindowType> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc);
      bVar1 = ::operator==((QFlags<Qt::WindowType>)in_stack_fffffffffffffedc.i,
                           in_stack_fffffffffffffed0);
      if (bVar1) {
        if (in_RCX == 0) {
          local_6c = QFontMetrics::height();
        }
        else {
          QWidget::fontMetrics
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_6c = QFontMetrics::height();
        }
        local_d5 = in_RCX != 0;
        local_80[1] = 0x10;
        piVar5 = qMax<int>(&local_6c,local_80 + 1);
        local_c4 = *piVar5;
        if (local_d5) {
          QFontMetrics::~QFontMetrics(local_78);
        }
      }
      else {
        pQVar4 = qobject_cast<QDockWidget_const*>((QObject *)0x3df6b4);
        if (pQVar4 == (QDockWidget *)0x0) {
          if (in_RCX == 0) {
            local_128 = QFontMetrics::height();
          }
          else {
            QWidget::fontMetrics
                      ((QWidget *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            local_128 = QFontMetrics::height();
          }
          local_d6 = in_RCX != 0;
          local_90 = local_128;
          local_9c = 0x12;
          piVar5 = qMax<int>(&local_90,&local_9c);
          local_c4 = *piVar5;
          if (local_d6) {
            QFontMetrics::~QFontMetrics(local_98);
          }
        }
        else {
          QWidget::fontMetrics
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_80[0] = QFontMetrics::height();
          qVar11 = QStyleHelper::dpiScaled
                             ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (QStyleOption *)
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_8c = (int)qVar11;
          piVar5 = qMax<int>(local_80,&local_8c);
          local_c4 = *piVar5;
          QFontMetrics::~QFontMetrics(local_88);
        }
      }
    }
    break;
  case 0x1b:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x1c:
  case 0x1d:
  case 0x20:
    local_c4 = 0;
    break;
  case 0x1f:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x21:
  case 0x3a:
    local_c4 = 2;
    break;
  case 0x22:
    local_c4 = 0;
    break;
  case 0x23:
  case 0x24:
    local_c4 = 0;
    break;
  case 0x25:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x26:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x27:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x28:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x2c:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x2d:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x2e:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x2f:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x30:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x31:
    local_c4 = 0;
    break;
  case 0x32:
    local_c4 = 2;
    break;
  case 0x33:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x34:
    local_c4 = 1;
    break;
  case 0x35:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x36:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x37:
    local_c4 = 0;
    break;
  case 0x38:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x39:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x3b:
    local_c4 = 0;
    pQVar10 = QGuiApplicationPrivate::platformTheme();
    if (pQVar10 != (QPlatformTheme *)0x0) {
      (**(code **)(*(long *)pQVar10 + 0x60))(&local_48,pQVar10,0xc);
      local_c4 = ::QVariant::toInt((bool *)&local_48);
      ::QVariant::~QVariant(&local_48);
    }
    if (local_c4 < 1) {
      qVar11 = QStyleHelper::dpiScaled
                         ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (QStyleOption *)
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_c4 = (int)qVar11;
    }
    break;
  case 0x3c:
    pQVar8 = qobject_cast<QSidebar_const*>((QObject *)0x3e009f);
    if (pQVar8 == (QSidebar *)0x0) {
      pQVar9 = QStyle::proxy(in_RDI);
      local_c4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x3e,in_RDX,in_RCX);
    }
    else {
      qVar11 = QStyleHelper::dpiScaled
                         ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (QStyleOption *)
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_c4 = (int)qVar11;
    }
    break;
  case 0x3d:
    pQVar9 = QStyle::proxy(in_RDI);
    local_c4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x3f,in_RDX,in_RCX);
    break;
  case 0x3e:
  case 0x48:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x3f:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x40:
  case 0x41:
    local_c4 = 2;
    break;
  case 0x42:
    local_c4 = 1;
    break;
  case 0x43:
  case 0x4a:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x44:
    pQVar9 = QStyle::proxy(in_RDI);
    local_c4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x3e,in_RDX,in_RCX);
    break;
  case 0x45:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x46:
    local_c4 = 0;
    break;
  case 0x47:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x49:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
    if (in_RDX == (QStyleOption *)0x0) {
      if (in_RCX != 0) {
        QWidget::isWindow((QWidget *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      }
    }
    else {
      local_a0.super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorage<QStyle::StateFlag>)
           QFlags<QStyle::StateFlag>::operator&
                     ((QFlags<QStyle::StateFlag> *)
                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      in_stack_fffffffffffffecc);
      ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_a0);
    }
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x4f:
  case 0x50:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x51:
    local_c4 = 1;
    break;
  case 0x52:
    pQVar10 = QGuiApplicationPrivate::platformTheme();
    (**(code **)(*(long *)pQVar10 + 0x60))(&local_68,pQVar10,8);
    local_c4 = ::QVariant::toInt((bool *)&local_68);
    ::QVariant::~QVariant(&local_68);
    break;
  case 0x53:
  case 0x54:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x55:
    pQVar9 = QStyle::proxy(in_RDI);
    local_c4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,5,in_RDX,in_RCX);
    local_c4 = local_c4 << 1;
    break;
  case 0x56:
    local_c4 = 0;
    break;
  case 0x57:
    pQVar9 = QStyle::proxy(in_RDI);
    local_c4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1e,in_RDX,in_RCX);
    local_c4 = -local_c4;
    break;
  case 0x58:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x59:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x5a:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x5b:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x5c:
    qVar11 = QStyleHelper::dpiScaled
                       ((qreal)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QStyleOption *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_c4 = (int)qVar11;
    break;
  case 0x5d:
    pQVar9 = QStyle::proxy(in_RDI);
    local_c4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x3e,in_RDX,in_RCX);
    break;
  case 0x5e:
    pQVar9 = QStyle::proxy(in_RDI);
    local_c4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x5d,in_RDX,in_RCX);
    local_c4 = local_c4 / 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c4;
  }
  __stack_chk_fail();
}

Assistant:

int QCommonStyle::pixelMetric(PixelMetric m, const QStyleOption *opt, const QWidget *widget) const
{
    int ret;

    switch (m) {
    case PM_FocusFrameVMargin:
    case PM_FocusFrameHMargin:
        ret = 2;
        break;
    case PM_MenuBarVMargin:
    case PM_MenuBarHMargin:
        ret = 0;
        break;
    case PM_TitleBarHeight:
    {
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            if ((tb->titleBarFlags & Qt::WindowType_Mask) == Qt::Tool) {
                ret = qMax(widget ? widget->fontMetrics().height() : opt->fontMetrics.height(), 16);
#if QT_CONFIG(dockwidget)
            } else if (qobject_cast<const QDockWidget*>(widget)) {
                ret = qMax(widget->fontMetrics().height(), int(QStyleHelper::dpiScaled(13, opt)));
#endif
            } else {
                ret = qMax(widget ? widget->fontMetrics().height() : opt->fontMetrics.height(), 18);
            }
        } else {
            ret = int(QStyleHelper::dpiScaled(18., opt));
        }
        break;
    }
    case PM_TitleBarButtonSize:
        ret = int(QStyleHelper::dpiScaled(16., opt));
        break;
    case PM_TitleBarButtonIconSize:
        ret = int(QStyleHelper::dpiScaled(16., opt));
        break;

    case PM_ScrollBarSliderMin:
        ret = int(QStyleHelper::dpiScaled(9., opt));
        break;

    case PM_ButtonMargin:
        ret = int(QStyleHelper::dpiScaled(6., opt));
        break;

    case PM_DockWidgetTitleBarButtonMargin:
        ret = int(QStyleHelper::dpiScaled(2., opt));
        break;

    case PM_ButtonDefaultIndicator:
        ret = 0;
        break;

    case PM_MenuButtonIndicator:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;

    case PM_ButtonShiftHorizontal:
    case PM_ButtonShiftVertical:

    case PM_DefaultFrameWidth:
        ret = 2;
        break;

    case PM_ComboBoxFrameWidth:
    case PM_SpinBoxFrameWidth:
    case PM_MenuPanelWidth:
    case PM_TabBarBaseOverlap:
    case PM_TabBarBaseHeight:
        ret = proxy()->pixelMetric(PM_DefaultFrameWidth, opt, widget);
        break;

    case PM_MdiSubWindowFrameWidth:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;

    case PM_MdiSubWindowMinimizedWidth:
        ret = int(QStyleHelper::dpiScaled(196, opt));
        break;

#if QT_CONFIG(scrollbar)
    case PM_ScrollBarExtent:
        if (qstyleoption_cast<const QStyleOptionSlider *>(opt))
            ret = 16;
        else
            ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
#endif
    case PM_MaximumDragDistance:
        ret = QGuiApplicationPrivate::platformTheme()->themeHint(QPlatformTheme::MaximumScrollBarDragDistance).toInt();
        break;

#if QT_CONFIG(slider)
    case PM_SliderThickness:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;

    case PM_SliderTickmarkOffset:
        if (const QStyleOptionSlider *sl = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            int space = (sl->orientation == Qt::Horizontal) ? sl->rect.height()
                                                            : sl->rect.width();
            int thickness = proxy()->pixelMetric(PM_SliderControlThickness, sl, widget);
            int ticks = sl->tickPosition;

            if (ticks == QSlider::TicksBothSides)
                ret = (space - thickness) / 2;
            else if (ticks == QSlider::TicksAbove)
                ret = space - thickness;
            else
                ret = 0;
        } else {
            ret = 0;
        }
        break;

    case PM_SliderSpaceAvailable:
        if (const QStyleOptionSlider *sl = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            if (sl->orientation == Qt::Horizontal)
                ret = sl->rect.width() - proxy()->pixelMetric(PM_SliderLength, sl, widget);
            else
                ret = sl->rect.height() - proxy()->pixelMetric(PM_SliderLength, sl, widget);
        } else {
            ret = 0;
        }
        break;
#endif // QT_CONFIG(slider)
#if QT_CONFIG(dockwidget)
    case PM_DockWidgetSeparatorExtent:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;

    case PM_DockWidgetHandleExtent:
        ret = int(QStyleHelper::dpiScaled(8, opt));
        break;
    case PM_DockWidgetTitleMargin:
        ret = 0;
        break;
    case PM_DockWidgetFrameWidth:
        ret = int(QStyleHelper::dpiScaled(1, opt));
        break;
#endif // QT_CONFIG(dockwidget)

    case PM_SpinBoxSliderHeight:
    case PM_MenuBarPanelWidth:
        ret = 2;
        break;

    case PM_MenuBarItemSpacing:
        ret = 0;
        break;

#if QT_CONFIG(toolbar)
    case PM_ToolBarFrameWidth:
        ret = 1;
        break;

    case PM_ToolBarItemMargin:
        ret = 0;
        break;

    case PM_ToolBarItemSpacing:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;

    case PM_ToolBarHandleExtent:
        ret = int(QStyleHelper::dpiScaled(8, opt));
        break;

    case PM_ToolBarSeparatorExtent:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;

    case PM_ToolBarExtensionExtent:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;
#endif // QT_CONFIG(toolbar)

#if QT_CONFIG(tabbar)
    case PM_TabBarTabOverlap:
        ret = 3;
        break;

    case PM_TabBarTabHSpace:
        ret = int(QStyleHelper::dpiScaled(24, opt));
        break;

    case PM_TabBarTabShiftHorizontal:
        ret = 0;
        break;

    case PM_TabBarTabShiftVertical:
        ret = 2;
        break;

    case PM_TabBarTabVSpace:
    {
        const QStyleOptionTab *tb = qstyleoption_cast<const QStyleOptionTab *>(opt);
        if (tb && (tb->shape == QTabBar::RoundedNorth || tb->shape == QTabBar::RoundedSouth
                   || tb->shape == QTabBar::RoundedWest || tb->shape == QTabBar::RoundedEast))
            ret = 8;
        else
            if (tb && (tb->shape == QTabBar::TriangularWest || tb->shape == QTabBar::TriangularEast))
                ret = 3;
            else
                ret = 2;
        break;
    }
#endif

    case PM_ProgressBarChunkWidth:
        ret = 9;
        break;

    case PM_IndicatorWidth:
        ret = int(QStyleHelper::dpiScaled(13, opt));
        break;

    case PM_IndicatorHeight:
        ret = int(QStyleHelper::dpiScaled(13, opt));
        break;

    case PM_ExclusiveIndicatorWidth:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;

    case PM_ExclusiveIndicatorHeight:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;

    case PM_MenuTearoffHeight:
        ret = int(QStyleHelper::dpiScaled(10, opt));
        break;

    case PM_MenuScrollerHeight:
        ret = int(QStyleHelper::dpiScaled(10, opt));
        break;

    case PM_MenuDesktopFrameWidth:
    case PM_MenuHMargin:
    case PM_MenuVMargin:
        ret = 0;
        break;

    case PM_HeaderMargin:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;
    case PM_HeaderMarkSize:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_HeaderGripMargin:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;
    case PM_HeaderDefaultSectionSizeHorizontal:
        ret = int(QStyleHelper::dpiScaled(100, opt));
        break;
    case PM_HeaderDefaultSectionSizeVertical:
        ret = int(QStyleHelper::dpiScaled(30, opt));
        break;
    case PM_TabBarScrollButtonWidth:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_LayoutLeftMargin:
    case PM_LayoutTopMargin:
    case PM_LayoutRightMargin:
    case PM_LayoutBottomMargin:
    {
        bool isWindow = false;
        if (opt) {
            isWindow = (opt->state & State_Window);
        } else if (widget) {
            isWindow = widget->isWindow();
        }
        ret = int(QStyleHelper::dpiScaled(isWindow ? 11 : 9, opt));
        break;
    }
    case PM_LayoutHorizontalSpacing:
    case PM_LayoutVerticalSpacing:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;

    case PM_ToolBarIconSize:
        ret = 0;
        if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme())
            ret = theme->themeHint(QPlatformTheme::ToolBarIconSize).toInt();
        if (ret <= 0)
            ret =  int(QStyleHelper::dpiScaled(24, opt));
        break;

    case PM_TabBarIconSize:
        ret = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
        break;
    case PM_ListViewIconSize:
#if QT_CONFIG(filedialog)
        if (qobject_cast<const QSidebar *>(widget))
            ret = int(QStyleHelper::dpiScaled(24., opt));
        else
#endif
            ret = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
        break;

    case PM_ButtonIconSize:
    case PM_SmallIconSize:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_IconViewIconSize:
        ret = proxy()->pixelMetric(PM_LargeIconSize, opt, widget);
        break;
    case PM_LineEditIconSize:
        ret = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
        break;
    case PM_LineEditIconMargin:
        ret = proxy()->pixelMetric(PM_LineEditIconSize, opt, widget) / 4;
        break;

    case PM_LargeIconSize:
        ret = int(QStyleHelper::dpiScaled(32, opt));
        break;

    case PM_ToolTipLabelFrameWidth:
        ret = 1;
        break;
    case PM_CheckBoxLabelSpacing:
    case PM_RadioButtonLabelSpacing:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;
    case PM_SizeGripSize:
        ret = int(QStyleHelper::dpiScaled(13, opt));
        break;
    case PM_MessageBoxIconSize:
#ifdef Q_OS_MAC
        if (QGuiApplication::desktopSettingsAware()) {
            ret = 64; // No DPI scaling, it's handled elsewhere.
        } else
#endif
        {
            ret = int(QStyleHelper::dpiScaled(32, opt));
        }
        break;
    case PM_TextCursorWidth:
        ret = QGuiApplicationPrivate::platformTheme()->themeHint(QPlatformTheme::TextCursorWidth).toInt();
        break;
    case PM_TabBar_ScrollButtonOverlap:
        ret = 1;
        break;
    case PM_TabCloseIndicatorWidth:
    case PM_TabCloseIndicatorHeight:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_ScrollView_ScrollBarSpacing:
        ret = 2 * proxy()->pixelMetric(PM_DefaultFrameWidth, opt, widget);
        break;
    case PM_ScrollView_ScrollBarOverlap:
        ret = 0;
        break;
    case PM_SubMenuOverlap:
        ret = -proxy()->pixelMetric(QStyle::PM_MenuPanelWidth, opt, widget);
        break;
    case PM_TreeViewIndentation:
        ret = int(QStyleHelper::dpiScaled(20, opt));
        break;
    default:
        ret = 0;
        break;
    }

    return ret;
}